

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int pagerUnlockDb(Pager *pPager,int eLock)

{
  uint in_ESI;
  long in_RDI;
  int rc;
  int in_stack_ffffffffffffffec;
  int iVar1;
  
  iVar1 = 0;
  if (**(long **)(in_RDI + 0x48) != 0) {
    if (*(char *)(in_RDI + 0x11) == '\0') {
      iVar1 = sqlite3OsUnlock((sqlite3_file *)((ulong)in_ESI << 0x20),in_stack_ffffffffffffffec);
    }
    else {
      iVar1 = 0;
    }
    if (*(char *)(in_RDI + 0x16) != '\x05') {
      *(char *)(in_RDI + 0x16) = (char)in_ESI;
    }
  }
  *(undefined1 *)(in_RDI + 0x17) = *(undefined1 *)(in_RDI + 0x10);
  return iVar1;
}

Assistant:

static int pagerUnlockDb(Pager *pPager, int eLock){
  int rc = SQLITE_OK;

  assert( !pPager->exclusiveMode || pPager->eLock==eLock );
  assert( eLock==NO_LOCK || eLock==SHARED_LOCK );
  assert( eLock!=NO_LOCK || pagerUseWal(pPager)==0 );
  if( isOpen(pPager->fd) ){
    assert( pPager->eLock>=eLock );
    rc = pPager->noLock ? SQLITE_OK : sqlite3OsUnlock(pPager->fd, eLock);
    if( pPager->eLock!=UNKNOWN_LOCK ){
      pPager->eLock = (u8)eLock;
    }
    IOTRACE(("UNLOCK %p %d\n", pPager, eLock))
  }
  pPager->changeCountDone = pPager->tempFile; /* ticket fb3b3024ea238d5c */
  return rc;
}